

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skippable_text.hpp
# Opt level: O0

void __thiscall
skippable_text<unsigned_int,_unsigned_int>::skippable_text
          (skippable_text<unsigned_int,_unsigned_int> *this,uint n)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  allocator_type *__a;
  uint in_ESI;
  undefined4 *in_RDI;
  uint64_t MASK;
  allocator_type *in_stack_ffffffffffffff08;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff10;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *this_00;
  size_type in_stack_ffffffffffffff18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff20;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_93;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_71;
  ulong local_50;
  undefined8 local_30;
  uint local_c;
  
  *in_RDI = 0xffffffff;
  in_RDI[1] = 0xffffffff;
  local_c = in_ESI;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x12335e);
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x12337f);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x123392);
  *(undefined1 *)(in_RDI + 0x16) = 0;
  in_RDI[0x17] = 0;
  in_RDI[8] = local_c;
  in_RDI[9] = local_c;
  local_30 = 0xffffffffffffffff;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1233ee);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             (value_type_conflict1 *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (in_stack_ffffffffffffff10,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff08);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffff10);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x12343f);
  if ((local_c & 0x3f) != 0) {
    uVar1 = 0xffffffffffffffffU >> ((byte)local_c & 0x3f) ^ 0xffffffffffffffff;
    local_50 = uVar1;
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 10));
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 10),
                        sVar2 - 1);
    *pvVar3 = uVar1 & *pvVar3;
  }
  uVar1 = (ulong)(((local_c >> 6) + 1) - (uint)((local_c & 0x3f) == 0));
  local_71.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._1_8_ = 0;
  this_01 = &local_71;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x123519);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (this_01,uVar1,(value_type_conflict1 *)in_stack_ffffffffffffff10,
             in_stack_ffffffffffffff08);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (in_stack_ffffffffffffff10,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff08);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffff10);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x12356c);
  __a = (allocator_type *)(ulong)local_c;
  local_93.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start._1_2_ = 0;
  this_00 = &local_93;
  std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)0x12358e);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)this_01,uVar1,
             (value_type_conflict2 *)this_00,__a);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=
            (this_00,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)__a);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(this_00);
  std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)0x1235d0);
  *(undefined1 *)(in_RDI + 0x16) = 0x10;
  return;
}

Assistant:

skippable_text(itype n){

		assert(n>0);

		this->n = n;
		non_blank_characters = n;

		non_blank = vector<uint64_t>(n/64+(n%64!=0),~uint64_t(0));//init all '1'

		if(n%64 != 0){//set to 0 bits in the right padding

			uint64_t MASK = ~((~uint64_t(0)) >> (n%64));
			non_blank[non_blank.size()-1] &= MASK;

		}

		//vector storing length of skips. Init with all 0
		skips = vector<uint64_t>(n/64+(n%64!=0),0);

		//T = int_vector<>(n, 0, width);
		T = vector<uint16_t>(n, 0); width = 16;

	}